

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::OnOpcodeV128
          (BinaryReaderObjdumpDisassemble *this,v128 value)

{
  if (this->in_function_body == true) {
    LogOpcode(this,"0x%08x 0x%08x 0x%08x 0x%08x",value.v._0_8_,value.v._0_8_ >> 0x20,value.v._8_8_,
              value.v._8_8_ >> 0x20);
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcodeV128(v128 value) {
  if (!in_function_body) {
    return Result::Ok;
  }
  // v128 is always dumped as i32x4:
  LogOpcode("0x%08x 0x%08x 0x%08x 0x%08x", value.u32(0), value.u32(1),
            value.u32(2), value.u32(3));
  return Result::Ok;
}